

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

QString * __thiscall VkSpecParser::parseName(QString *__return_storage_ptr__,VkSpecParser *this)

{
  char cVar1;
  int iVar2;
  longlong extraout_RDX;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  undefined1 auVar5 [16];
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QArrayData *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  cVar1 = QXmlStreamReader::atEnd();
  while (cVar1 == '\0') {
    QXmlStreamReader::readNext();
    iVar2 = QXmlStreamReader::tokenType();
    if (iVar2 == 5) {
      auVar5 = QXmlStreamReader::name();
      if ((auVar5._0_8_ == 4) &&
         (QVar3.m_data = auVar5._8_8_, QVar3.m_size = 4, QVar4.m_data = L"name", QVar4.m_size = 4,
         cVar1 = QtPrivate::equalStrings(QVar3,QVar4), cVar1 != '\0')) break;
    }
    QXmlStreamReader::text();
    QString::append((QChar *)&local_48,extraout_RDX);
    cVar1 = QXmlStreamReader::atEnd();
  }
  QString::trimmed_helper(__return_storage_ptr__);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VkSpecParser::parseName()
{
    QString name;
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("name"))
            break;
        name += m_reader.text();
    }
    return name.trimmed();
}